

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

int Abc_NodeStrashToGia(Gia_Man_t *pNew,Abc_Obj_t *pNode)

{
  Hop_Man_t *p;
  Hop_Obj_t *p_00;
  int iVar1;
  int c;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  Abc_Obj_t *pAVar4;
  int local_3c;
  int i;
  Abc_Obj_t *pFanin;
  Hop_Obj_t *pRoot;
  Hop_Man_t *pMan;
  Abc_Obj_t *pNode_local;
  Gia_Man_t *pNew_local;
  
  p = (Hop_Man_t *)pNode->pNtk->pManFunc;
  p_00 = *(Hop_Obj_t **)&(pNode->field_5).iData;
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x3d,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_NtkHasAig(pNode->pNtk);
  if ((iVar1 != 0) && (iVar1 = Abc_NtkIsStrash(pNode->pNtk), iVar1 == 0)) {
    iVar1 = Abc_NodeIsConst(pNode);
    if (iVar1 == 0) {
      pHVar2 = Hop_Regular(p_00);
      pHVar3 = Hop_ManConst1(p);
      if (pHVar2 != pHVar3) {
        local_3c = 0;
        while( true ) {
          iVar1 = Abc_ObjFaninNum(pNode);
          if (iVar1 <= local_3c) {
            for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_3c < iVar1;
                local_3c = local_3c + 1) {
              pAVar4 = Abc_ObjFanin(pNode,local_3c);
              iVar1 = (pAVar4->field_6).iTemp;
              pHVar2 = Hop_IthVar(p,local_3c);
              (pHVar2->field_0).iData = iVar1;
            }
            pHVar2 = Hop_Regular(p_00);
            Abc_NodeStrashToGia_rec(pNew,pHVar2);
            pHVar2 = Hop_Regular(p_00);
            Hop_ConeUnmark_rec(pHVar2);
            pHVar2 = Hop_Regular(p_00);
            iVar1 = (pHVar2->field_0).iData;
            c = Hop_IsComplement(p_00);
            iVar1 = Abc_LitNotCond(iVar1,c);
            return iVar1;
          }
          pAVar4 = Abc_ObjFanin(pNode,local_3c);
          if ((pAVar4->field_6).iTemp == -1) break;
          local_3c = local_3c + 1;
        }
        __assert_fail("pFanin->iTemp != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,0x44,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
      }
    }
    iVar1 = Hop_IsComplement(p_00);
    iVar1 = Abc_LitNotCond(1,iVar1);
    return iVar1;
  }
  __assert_fail("Abc_NtkHasAig(pNode->pNtk) && !Abc_NtkIsStrash(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                ,0x3e,"int Abc_NodeStrashToGia(Gia_Man_t *, Abc_Obj_t *)");
}

Assistant:

int Abc_NodeStrashToGia( Gia_Man_t * pNew, Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    Hop_Obj_t * pRoot = (Hop_Obj_t *)pNode->pData;
    Abc_Obj_t * pFanin;  int i;
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_NtkHasAig(pNode->pNtk) && !Abc_NtkIsStrash(pNode->pNtk) );
    // check the constant case
    if ( Abc_NodeIsConst(pNode) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Abc_LitNotCond( 1, Hop_IsComplement(pRoot) );
    // set elementary variables
    Abc_ObjForEachFanin( pNode, pFanin, i )
        assert( pFanin->iTemp != -1 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Hop_IthVar(pMan, i)->iData = pFanin->iTemp;
    // strash the AIG of this node
    Abc_NodeStrashToGia_rec( pNew, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Abc_LitNotCond( Hop_Regular(pRoot)->iData, Hop_IsComplement(pRoot) );
}